

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-quantize-perf.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  size_type __n;
  char **ppcVar1;
  bool bVar2;
  bool bVar3;
  size_t sVar4;
  undefined8 uVar5;
  pointer puVar6;
  char *pcVar7;
  int iVar8;
  undefined8 uVar9;
  int *piVar10;
  long lVar11;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  ulong uVar12;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var13;
  char *pcVar14;
  size_t sVar15;
  uint uVar16;
  ulong uVar17;
  size_t i;
  long lVar18;
  ulong uVar19;
  pointer puVar20;
  int iVar21;
  char **ppcVar22;
  float fVar23;
  string op;
  size_t size_1;
  ggml_type_traits_cpu *qfns_cpu;
  float *test_q1;
  float *test_data1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> test_data1_v;
  ggml_type_traits *qfns;
  vector<unsigned_char,_std::allocator<unsigned_char>_> test_data2_v;
  string arg;
  float *test_q2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> test_q1_v;
  float *test_out;
  vector<unsigned_char,_std::allocator<unsigned_char>_> test_out_v;
  vector<unsigned_char,_std::allocator<unsigned_char>_> test_q2_v;
  _Any_data local_198;
  code *local_188;
  code *pcStack_180;
  size_t local_170;
  ulong local_168;
  ulong local_160;
  undefined1 local_158 [24];
  vector<unsigned_long,_std::allocator<unsigned_long>_> vStack_140;
  uint uStack_128;
  undefined4 uStack_124;
  bool bStack_120;
  bool bStack_11f;
  bool bStack_11e;
  bool bStack_11d;
  bool bStack_11c;
  ulong local_118;
  char **local_108;
  long *local_100;
  long local_f8;
  long local_f0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_e8;
  long local_d0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_c8;
  undefined1 *local_b0;
  char *local_a8;
  undefined1 local_a0;
  undefined7 uStack_9f;
  long local_90;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  undefined8 local_70;
  long local_68;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  uStack_128 = 0;
  uStack_124 = 0;
  bStack_120 = false;
  bStack_11f = false;
  bStack_11e = false;
  bStack_11d = false;
  bStack_11c = false;
  vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_5_ = 0;
  vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
  local_158._16_8_ = (pointer)0x0;
  vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (size_t *)0x0;
  local_158._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_158._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_118 = 10;
  local_b0 = &local_a0;
  local_a8 = (char *)0x0;
  local_a0 = 0;
  if (argc < 2) {
    uVar16 = 0;
    bVar3 = true;
    iVar21 = 0;
  }
  else {
    iVar21 = 1;
    local_168 = local_168 & 0xffffffff00000000;
    local_160 = CONCAT44(local_160._4_4_,argc);
    local_108 = argv;
    do {
      pcVar7 = local_a8;
      pcVar14 = argv[iVar21];
      strlen(pcVar14);
      std::__cxx11::string::_M_replace((ulong)&local_b0,0,pcVar7,(ulong)pcVar14);
      uVar9 = std::__cxx11::string::compare((char *)&local_b0);
      if ((int)uVar9 == 0) {
        iVar21 = iVar21 + 1;
        if (argc <= iVar21) goto LAB_00102ba5;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_198._M_pod_data,argv[iVar21],(allocator<char> *)&local_88);
        uVar9 = local_198._M_unused._0_8_;
        piVar10 = __errno_location();
        iVar8 = *piVar10;
        *piVar10 = 0;
        uVar12 = strtol((char *)uVar9,(char **)&local_e8,10);
        argv = local_108;
        if (local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start == (pointer)uVar9) {
          std::__throw_invalid_argument("stoi");
        }
        else if ((0xfffffffeffffffff < uVar12 - 0x80000000) && (*piVar10 != 0x22)) {
          if (*piVar10 == 0) {
            *piVar10 = iVar8;
          }
          if ((code **)local_198._M_unused._0_8_ != &local_188) {
            operator_delete(local_198._M_unused._M_object,(ulong)(local_188 + 1));
          }
          local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)(long)(int)uVar12;
          argc = (int)local_160;
          if ((uVar12 & 0x1f) == 0) {
            if (vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                .super__Vector_impl_data._M_finish ==
                (unsigned_long *)
                CONCAT35(vStack_140.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage._5_3_,
                         vStack_140.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage._0_5_)) {
              bVar3 = false;
              std::vector<unsigned_long,std::allocator<unsigned_long>>::
              _M_realloc_insert<unsigned_long_const&>
                        ((vector<unsigned_long,std::allocator<unsigned_long>> *)&vStack_140,
                         (iterator)
                         vStack_140.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish,(unsigned_long *)&local_c8);
            }
            else {
              *vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish =
                   (unsigned_long)
                   local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
              vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
              bVar3 = false;
            }
          }
          else {
            iVar8 = fprintf(_stderr,"error: size %zu not divisible by 32\n");
            local_168 = CONCAT44(local_168._4_4_,(int)CONCAT71((uint7)(uint3)((uint)iVar8 >> 8),1));
            bVar3 = true;
          }
          if ((uVar12 & 0x1f) == 0) goto LAB_00102b5b;
          goto LAB_00102bb0;
        }
        std::__throw_out_of_range("stoi");
LAB_00103748:
        std::__throw_out_of_range("stoi");
LAB_00103754:
        std::__throw_invalid_argument("stoi");
LAB_00103760:
        std::__throw_out_of_range("stoi");
LAB_0010376c:
        uVar9 = std::__throw_invalid_argument("stoi");
        if (local_b0 != &local_a0) {
          operator_delete(local_b0,CONCAT71(uStack_9f,local_a0) + 1);
        }
        quantize_perf_params::~quantize_perf_params((quantize_perf_params *)local_158);
        _Unwind_Resume(uVar9);
      }
      iVar8 = std::__cxx11::string::compare((char *)&local_b0);
      if (iVar8 == 0) {
        local_198._M_unused._M_member_pointer = 0x1000;
        if (vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            (unsigned_long *)
            CONCAT35(vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage._5_3_,
                     vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage._0_5_)) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
          _M_realloc_insert<unsigned_long>
                    (&vStack_140,
                     (iterator)
                     vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish,
                     (unsigned_long *)local_198._M_pod_data);
        }
        else {
          *vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish = 0x1000;
          vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        local_198._M_unused._M_member_pointer = 0x10000;
        if (vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            (unsigned_long *)
            CONCAT35(vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage._5_3_,
                     vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage._0_5_)) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
          _M_realloc_insert<unsigned_long>
                    (&vStack_140,
                     (iterator)
                     vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish,
                     (unsigned_long *)local_198._M_pod_data);
        }
        else {
          *vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish = 0x10000;
          vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        local_198._M_unused._M_object = (code **)0xa0000;
        if (vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            (unsigned_long *)
            CONCAT35(vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage._5_3_,
                     vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage._0_5_)) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
          _M_realloc_insert<unsigned_long>
                    (&vStack_140,
                     (iterator)
                     vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish,
                     (unsigned_long *)local_198._M_pod_data);
        }
        else {
          *vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish = 0xa0000;
LAB_001029ea:
          vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
      }
      else {
        iVar8 = std::__cxx11::string::compare((char *)&local_b0);
        if (iVar8 != 0) {
          uVar9 = std::__cxx11::string::compare((char *)&local_b0);
          if ((int)uVar9 == 0) {
            iVar21 = iVar21 + 1;
            if (iVar21 < argc) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_198._M_pod_data,argv[iVar21],(allocator<char> *)&local_e8);
              iVar8 = std::__cxx11::string::compare(local_198._M_pod_data);
              if (iVar8 == 0) {
                bStack_120 = true;
LAB_00102b33:
                bVar3 = false;
                bVar2 = true;
              }
              else {
                iVar8 = std::__cxx11::string::compare(local_198._M_pod_data);
                if (iVar8 == 0) {
                  bStack_11f = true;
                  goto LAB_00102b33;
                }
                iVar8 = std::__cxx11::string::compare(local_198._M_pod_data);
                if (iVar8 == 0) {
                  bStack_11e = true;
                  goto LAB_00102b33;
                }
                iVar8 = std::__cxx11::string::compare(local_198._M_pod_data);
                if (iVar8 == 0) {
                  bStack_11d = true;
                  goto LAB_00102b33;
                }
                uVar9 = std::__cxx11::string::compare(local_198._M_pod_data);
                if ((int)uVar9 == 0) {
                  bStack_11c = true;
                  goto LAB_00102b33;
                }
                local_168 = CONCAT44(local_168._4_4_,(int)CONCAT71((int7)((ulong)uVar9 >> 8),1));
                bVar3 = true;
                bVar2 = false;
              }
              if ((code **)local_198._M_unused._0_8_ != &local_188) {
                operator_delete(local_198._M_unused._M_object,(ulong)(local_188 + 1));
              }
              argc = (int)local_160;
              if (bVar2) goto LAB_00102b5b;
              goto LAB_00102bb0;
            }
          }
          else {
            uVar9 = std::__cxx11::string::compare((char *)&local_b0);
            if ((int)uVar9 == 0) {
              iVar21 = iVar21 + 1;
              if (iVar21 < argc) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)local_198._M_pod_data,argv[iVar21],(allocator<char> *)&local_e8
                          );
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           local_158,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_198);
                if ((code **)local_198._M_unused._0_8_ != &local_188) {
                  operator_delete(local_198._M_unused._M_object,(ulong)(local_188 + 1));
                }
                goto LAB_00102b5b;
              }
            }
            else {
              uVar9 = std::__cxx11::string::compare((char *)&local_b0);
              if ((int)uVar9 == 0) {
                iVar21 = iVar21 + 1;
                if (iVar21 < argc) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)local_198._M_pod_data,argv[iVar21],
                             (allocator<char> *)&local_c8);
                  uVar9 = local_198._M_unused._0_8_;
                  piVar10 = __errno_location();
                  iVar8 = *piVar10;
                  *piVar10 = 0;
                  lVar11 = strtol((char *)uVar9,(char **)&local_e8,10);
                  argv = local_108;
                  if (local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start == (pointer)uVar9) goto LAB_0010376c;
                  if ((lVar11 - 0x80000000U < 0xffffffff00000000) || (*piVar10 == 0x22))
                  goto LAB_00103760;
                  if (*piVar10 == 0) {
                    *piVar10 = iVar8;
                  }
                  if ((code **)local_198._M_unused._0_8_ != &local_188) {
                    operator_delete(local_198._M_unused._M_object,(ulong)(local_188 + 1));
                  }
                  if ((uint)lVar11 < 0x41) {
                    uStack_128 = (uint)lVar11 & 0x7f;
                    uStack_124 = 0;
                    argc = (int)local_160;
                    goto LAB_00102b5b;
                  }
                  main_cold_3();
                  local_168 = CONCAT44(local_168._4_4_,
                                       (int)CONCAT71((int7)((ulong)extraout_RAX_00 >> 8),1));
                  bVar3 = true;
                  goto LAB_00102bb0;
                }
              }
              else {
                uVar9 = std::__cxx11::string::compare((char *)&local_b0);
                if (((int)uVar9 != 0) &&
                   (uVar9 = std::__cxx11::string::compare((char *)&local_b0), (int)uVar9 != 0)) {
                  iVar21 = std::__cxx11::string::compare((char *)&local_b0);
                  if ((iVar21 == 0) ||
                     (iVar21 = std::__cxx11::string::compare((char *)&local_b0), iVar21 == 0)) {
                    usage(argv);
                    iVar21 = 1;
                    bVar3 = false;
                    uVar16 = (uint)local_168;
                    goto LAB_00102bbc;
                  }
                  main_cold_1();
                  iVar21 = 1;
                  bVar3 = false;
                  goto LAB_00102bb8;
                }
                iVar21 = iVar21 + 1;
                if (iVar21 < argc) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)local_198._M_pod_data,argv[iVar21],
                             (allocator<char> *)&local_c8);
                  uVar9 = local_198._M_unused._0_8_;
                  piVar10 = __errno_location();
                  iVar8 = *piVar10;
                  *piVar10 = 0;
                  lVar11 = strtol((char *)uVar9,(char **)&local_e8,10);
                  argv = local_108;
                  if (local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start == (pointer)uVar9) goto LAB_00103754;
                  if ((lVar11 - 0x80000000U < 0xffffffff00000000) || (*piVar10 == 0x22))
                  goto LAB_00103748;
                  if (*piVar10 == 0) {
                    *piVar10 = iVar8;
                  }
                  if ((code **)local_198._M_unused._0_8_ != &local_188) {
                    operator_delete(local_198._M_unused._M_object,(ulong)(local_188 + 1));
                  }
                  if ((uint)lVar11 < 0x5f5e101) {
                    local_118 = (ulong)((uint)lVar11 & 0x7ffffff);
                    argc = (int)local_160;
                    goto LAB_00102b5b;
                  }
                  main_cold_2();
                  local_168 = CONCAT44(local_168._4_4_,
                                       (int)CONCAT71((int7)((ulong)extraout_RAX >> 8),1));
                  bVar3 = true;
                  goto LAB_00102bb0;
                }
              }
            }
          }
LAB_00102ba5:
          local_168 = CONCAT44(local_168._4_4_,(int)CONCAT71((int7)((ulong)uVar9 >> 8),1));
          break;
        }
        local_198._M_unused._M_member_pointer = 0x1000;
        if (vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            (unsigned_long *)
            CONCAT35(vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage._5_3_,
                     vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage._0_5_)) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
          _M_realloc_insert<unsigned_long>
                    (&vStack_140,
                     (iterator)
                     vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish,
                     (unsigned_long *)local_198._M_pod_data);
        }
        else {
          *vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish = 0x1000;
          vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        local_198._M_unused._M_member_pointer = 0x10000;
        if (vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            (unsigned_long *)
            CONCAT35(vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage._5_3_,
                     vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage._0_5_)) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
          _M_realloc_insert<unsigned_long>
                    (&vStack_140,
                     (iterator)
                     vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish,
                     (unsigned_long *)local_198._M_pod_data);
        }
        else {
          *vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish = 0x10000;
          vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        local_198._M_unused._M_object = (void *)0xa0000;
        if (vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            (unsigned_long *)
            CONCAT35(vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage._5_3_,
                     vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage._0_5_)) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
          _M_realloc_insert<unsigned_long>
                    (&vStack_140,
                     (iterator)
                     vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish,
                     (unsigned_long *)local_198._M_pod_data);
        }
        else {
          *vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish = 0xa0000;
          vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        local_198._M_unused._M_object = (code **)0x3e80000;
        if (vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            (unsigned_long *)
            CONCAT35(vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage._5_3_,
                     vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage._0_5_)) {
          *vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish = 0x3e80000;
          goto LAB_001029ea;
        }
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  (&vStack_140,
                   (iterator)
                   vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)local_198._M_pod_data)
        ;
      }
LAB_00102b5b:
      iVar21 = iVar21 + 1;
    } while (iVar21 < argc);
    bVar3 = true;
LAB_00102bb0:
    iVar21 = 0;
LAB_00102bb8:
    uVar16 = (uint)local_168;
  }
LAB_00102bbc:
  if (bVar3) {
    if ((uVar16 & 1) == 0) {
      if (vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start ==
          vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        local_198._M_unused._M_member_pointer = 0x1000;
        if (vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            (unsigned_long *)
            CONCAT35(vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage._5_3_,
                     vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage._0_5_)) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
          _M_realloc_insert<unsigned_long>
                    (&vStack_140,
                     (iterator)
                     vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish,
                     (unsigned_long *)local_198._M_pod_data);
        }
        else {
          *vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish = 0x1000;
          vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
      }
      puVar20 = vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                .super__Vector_impl_data._M_finish;
      puVar6 = vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((((bStack_120 == false) && (bStack_11f == false)) && (bStack_11e == false)) &&
         ((bStack_11d == false && (bStack_11c == false)))) {
        bStack_11c = true;
        bStack_120 = true;
        bStack_11f = true;
        bStack_11e = true;
        bStack_11d = true;
      }
      if (vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start !=
          vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        uVar12 = (long)vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3;
        lVar11 = 0x3f;
        if (uVar12 != 0) {
          for (; uVar12 >> lVar11 == 0; lVar11 = lVar11 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish,((uint)lVar11 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (puVar6,puVar20);
      }
      ppcVar1 = (char **)vStack_140.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish[-1];
      __n = (long)ppcVar1 * 4 + 0x80;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_e8,__n,(allocator_type *)local_198._M_pod_data);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_c8,__n,(allocator_type *)local_198._M_pod_data);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_88,__n,(allocator_type *)local_198._M_pod_data);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_48,__n,(allocator_type *)local_198._M_pod_data);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_60,__n,(allocator_type *)local_198._M_pod_data);
      lVar11 = (long)(int)uStack_128;
      uVar12 = (long)local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start + 0x3fU & 0xffffffffffffffc0;
      uVar17 = 0;
      if (0xc0 < uVar12 - (long)local_e8.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start) {
        uVar12 = uVar17;
      }
      lVar18 = uVar12 + lVar11;
      uVar12 = (ulong)(local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start + 0x3f) & 0xffffffffffffffc0;
      if (0xc0 < ((ulong)(local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start + 0x3f) & 0xffffffffffffffc0) -
                 (long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start) {
        uVar12 = uVar17;
      }
      uVar19 = (ulong)(local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start + 0x3f) & 0xffffffffffffffc0;
      if (0xc0 < ((ulong)(local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start + 0x3f) & 0xffffffffffffffc0) -
                 (long)local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start) {
        uVar19 = uVar17;
      }
      local_f8 = uVar19 + lVar11;
      uVar19 = (ulong)(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start + 0x3f) & 0xffffffffffffffc0;
      if (0xc0 < ((ulong)(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start + 0x3f) & 0xffffffffffffffc0) -
                 (long)local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start) {
        uVar19 = uVar17;
      }
      local_90 = uVar19 + lVar11;
      uVar19 = (ulong)(local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start + 0x3f) & 0xffffffffffffffc0;
      if (0xc0 < ((ulong)(local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start + 0x3f) & 0xffffffffffffffc0) -
                 (long)local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start) {
        uVar19 = uVar17;
      }
      local_68 = uVar19 + lVar11;
      local_f0 = lVar18;
      if (ppcVar1 != (char **)0x0) {
        ppcVar22 = (char **)0x0;
        do {
          fVar23 = cosf((float)ppcVar22);
          *(float *)(lVar18 + (long)ppcVar22 * 4) = fVar23 + fVar23 + 0.1;
          ppcVar22 = (char **)((long)ppcVar22 + 1);
        } while (ppcVar1 != ppcVar22);
        ppcVar22 = (char **)0x0;
        do {
          fVar23 = cosf((float)ppcVar22 + 1.0);
          *(float *)(uVar12 + lVar11 + (long)ppcVar22 * 4) = fVar23 + fVar23 + 0.1;
          ppcVar22 = (char **)((long)ppcVar22 + 1);
        } while (ppcVar1 != ppcVar22);
      }
      local_160 = local_118;
      local_168 = uVar12 + lVar11;
      local_108 = ppcVar1;
      local_70 = ggml_init();
      iVar21 = 0;
      do {
        local_d0 = ggml_get_type_traits(iVar21);
        local_100 = (long *)ggml_get_type_traits_cpu(iVar21);
        if ((local_158._0_8_ == local_158._8_8_) ||
           (lVar11 = ggml_type_name(iVar21), uVar5 = local_158._8_8_, uVar9 = local_158._0_8_,
           lVar11 == 0)) {
LAB_00102f43:
          if ((*local_100 != 0) && (*(long *)(local_d0 + 0x28) != 0)) {
            pcVar14 = (char *)ggml_type_name(iVar21);
            puts(pcVar14);
            ggml_quantize_init(iVar21);
            if (bStack_120 == true) {
              puts("  quantize_row_q_reference");
              puVar6 = vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
              for (puVar20 = vStack_140.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start; puVar20 != puVar6;
                  puVar20 = puVar20 + 1) {
                local_170 = *puVar20;
                uVar12 = local_170 * 4;
                if ((long)uVar12 < 0) {
                  fVar23 = (float)(uVar12 >> 1) + (float)(uVar12 >> 1);
                }
                else {
                  fVar23 = (float)(long)uVar12;
                }
                printf("    %zu values (%.2f MB)\n",SUB84((double)(fVar23 * 9.536743e-07),0));
                sVar15 = ggml_row_size(iVar21,local_170);
                sVar4 = local_170;
                local_188 = (code *)0x0;
                pcStack_180 = (code *)0x0;
                local_198._M_unused._M_object = (void *)0x0;
                local_198._8_8_ = 0;
                local_198._M_unused._M_object = operator_new(0x20);
                *(long **)local_198._M_unused._0_8_ = &local_d0;
                *(long **)((long)local_198._M_unused._0_8_ + 8) = &local_f0;
                *(long **)((long)local_198._M_unused._0_8_ + 0x10) = &local_f8;
                *(size_t **)((long)local_198._M_unused._0_8_ + 0x18) = &local_170;
                pcStack_180 = std::
                              _Function_handler<float_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-quantize-perf.cpp:289:40)>
                              ::_M_invoke;
                local_188 = std::
                            _Function_handler<float_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-quantize-perf.cpp:289:40)>
                            ::_M_manager;
                benchmark_function(sVar4,sVar15,local_160,(function<float_()> *)&local_198);
                if (local_188 != (code *)0x0) {
                  (*local_188)(&local_198,&local_198,3);
                }
              }
              putchar(10);
            }
            if (bStack_11f == true) {
              puts("  quantize_row_q");
              puVar6 = vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
              for (puVar20 = vStack_140.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start; puVar20 != puVar6;
                  puVar20 = puVar20 + 1) {
                local_170 = *puVar20;
                uVar12 = local_170 * 4;
                if ((long)uVar12 < 0) {
                  fVar23 = (float)(uVar12 >> 1) + (float)(uVar12 >> 1);
                }
                else {
                  fVar23 = (float)(long)uVar12;
                }
                printf("    %zu values (%.2f MB)\n",SUB84((double)(fVar23 * 9.536743e-07),0));
                sVar15 = ggml_row_size(iVar21,local_170);
                sVar4 = local_170;
                local_188 = (code *)0x0;
                pcStack_180 = (code *)0x0;
                local_198._M_unused._M_object = (void *)0x0;
                local_198._8_8_ = 0;
                local_198._M_unused._M_object = operator_new(0x20);
                *(long ***)local_198._M_unused._0_8_ = &local_100;
                *(long **)((long)local_198._M_unused._0_8_ + 8) = &local_f0;
                *(long **)((long)local_198._M_unused._0_8_ + 0x10) = &local_f8;
                *(size_t **)((long)local_198._M_unused._0_8_ + 0x18) = &local_170;
                pcStack_180 = std::
                              _Function_handler<float_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-quantize-perf.cpp:303:40)>
                              ::_M_invoke;
                local_188 = std::
                            _Function_handler<float_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-quantize-perf.cpp:303:40)>
                            ::_M_manager;
                benchmark_function(sVar4,sVar15,local_160,(function<float_()> *)&local_198);
                if (local_188 != (code *)0x0) {
                  (*local_188)(&local_198,&local_198,3);
                }
              }
              putchar(10);
            }
            if (bStack_11e == true) {
              puts("  dequantize_row_q");
              (*(code *)*local_100)(local_f0,local_f8,local_108);
              puVar6 = vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
              for (puVar20 = vStack_140.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start; puVar20 != puVar6;
                  puVar20 = puVar20 + 1) {
                local_170 = *puVar20;
                uVar12 = local_170 * 4;
                if ((long)uVar12 < 0) {
                  fVar23 = (float)(uVar12 >> 1) + (float)(uVar12 >> 1);
                }
                else {
                  fVar23 = (float)(long)uVar12;
                }
                printf("    %zu values (%.2f MB)\n",SUB84((double)(fVar23 * 9.536743e-07),0));
                sVar15 = ggml_row_size(iVar21,local_170);
                sVar4 = local_170;
                local_188 = (code *)0x0;
                pcStack_180 = (code *)0x0;
                local_198._M_unused._M_object = (void *)0x0;
                local_198._8_8_ = 0;
                local_198._M_unused._M_object = operator_new(0x20);
                *(long **)local_198._M_unused._0_8_ = &local_d0;
                *(long **)((long)local_198._M_unused._0_8_ + 8) = &local_f8;
                *(long **)((long)local_198._M_unused._0_8_ + 0x10) = &local_68;
                *(size_t **)((long)local_198._M_unused._0_8_ + 0x18) = &local_170;
                pcStack_180 = std::
                              _Function_handler<float_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-quantize-perf.cpp:318:40)>
                              ::_M_invoke;
                local_188 = std::
                            _Function_handler<float_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-quantize-perf.cpp:318:40)>
                            ::_M_manager;
                benchmark_function(sVar4,sVar15,local_160,(function<float_()> *)&local_198);
                if (local_188 != (code *)0x0) {
                  (*local_188)(&local_198,&local_198,3);
                }
              }
              putchar(10);
            }
            if (bStack_11d == true) {
              puts("  quantize_row_q_dot");
              puVar6 = vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
              for (puVar20 = vStack_140.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start; puVar20 != puVar6;
                  puVar20 = puVar20 + 1) {
                local_170 = *puVar20;
                uVar12 = local_170 * 4;
                if ((long)uVar12 < 0) {
                  fVar23 = (float)(uVar12 >> 1) + (float)(uVar12 >> 1);
                }
                else {
                  fVar23 = (float)(long)uVar12;
                }
                printf("    %zu values (%.2f MB)\n",SUB84((double)(fVar23 * 9.536743e-07),0));
                sVar15 = ggml_row_size(iVar21,local_170);
                sVar4 = local_170;
                local_188 = (code *)0x0;
                pcStack_180 = (code *)0x0;
                local_198._M_unused._M_object = (void *)0x0;
                local_198._8_8_ = 0;
                local_198._M_unused._M_object = operator_new(0x20);
                *(long ***)local_198._M_unused._0_8_ = &local_100;
                *(long **)((long)local_198._M_unused._0_8_ + 8) = &local_f0;
                *(long **)((long)local_198._M_unused._0_8_ + 0x10) = &local_f8;
                *(size_t **)((long)local_198._M_unused._0_8_ + 0x18) = &local_170;
                pcStack_180 = std::
                              _Function_handler<float_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-quantize-perf.cpp:332:40)>
                              ::_M_invoke;
                local_188 = std::
                            _Function_handler<float_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-quantize-perf.cpp:332:40)>
                            ::_M_manager;
                benchmark_function(sVar4,sVar15,local_160,(function<float_()> *)&local_198);
                if (local_188 != (code *)0x0) {
                  (*local_188)(&local_198,&local_198,3);
                }
              }
              putchar(10);
            }
            if (bStack_11c == true) {
              puts("  vec_dot_q");
              (*(code *)*local_100)(local_f0,local_f8,local_108);
              (*(code *)*local_100)(local_168,local_90,local_108);
              puVar6 = vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
              for (puVar20 = vStack_140.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start; puVar20 != puVar6;
                  puVar20 = puVar20 + 1) {
                local_170 = *puVar20;
                uVar12 = local_170 * 4;
                if ((long)uVar12 < 0) {
                  fVar23 = (float)(uVar12 >> 1) + (float)(uVar12 >> 1);
                }
                else {
                  fVar23 = (float)(long)uVar12;
                }
                printf("    %zu values (%.2f MB)\n",SUB84((double)(fVar23 * 9.536743e-07),0));
                sVar15 = ggml_row_size(iVar21,local_170);
                sVar4 = local_170;
                local_188 = (code *)0x0;
                pcStack_180 = (code *)0x0;
                local_198._M_unused._M_object = (void *)0x0;
                local_198._8_8_ = 0;
                local_198._M_unused._M_object = operator_new(0x20);
                *(long ***)local_198._M_unused._0_8_ = &local_100;
                *(size_t **)((long)local_198._M_unused._0_8_ + 8) = &local_170;
                *(long **)((long)local_198._M_unused._0_8_ + 0x10) = &local_f8;
                *(long **)((long)local_198._M_unused._0_8_ + 0x18) = &local_90;
                pcStack_180 = std::
                              _Function_handler<float_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-quantize-perf.cpp:349:40)>
                              ::_M_invoke;
                local_188 = std::
                            _Function_handler<float_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-quantize-perf.cpp:349:40)>
                            ::_M_manager;
                benchmark_function(sVar4,sVar15,local_160,(function<float_()> *)&local_198);
                if (local_188 != (code *)0x0) {
                  (*local_188)(&local_198,&local_198,3);
                }
              }
              putchar(10);
            }
          }
        }
        else {
          local_198._M_unused._0_8_ = (undefined8)ggml_type_name(iVar21);
          _Var13 = std::
                   __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const*const>>
                             (uVar9,uVar5,&local_198);
          if (_Var13._M_current !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158._8_8_)
          goto LAB_00102f43;
        }
        iVar21 = iVar21 + 1;
      } while (iVar21 != 0x27);
      ggml_free(local_70);
      if (local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_60.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_60.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_48.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_88.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_88.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_c8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_c8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if ((code **)local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start != (code **)0x0) {
        operator_delete(local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_e8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_e8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      iVar21 = 0;
    }
    else {
      main_cold_4();
      iVar21 = 1;
    }
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,CONCAT71(uStack_9f,local_a0) + 1);
  }
  if (vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (size_t *)0x0) {
    operator_delete(vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    CONCAT35(vStack_140.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage._5_3_,
                             vStack_140.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage._0_5_) -
                    (long)vStack_140.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_158);
  return iVar21;
}

Assistant:

int main(int argc, char * argv[]) {
    quantize_perf_params params {};

    // read command line

    bool invalid_param = false;
    std::string arg;
    for (int i = 1; i < argc; i++) {
        arg = argv[i];

        if (arg == "--size") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            size_t size = std::stoi(argv[i]);
            if (size % 32 != 0) {
                fprintf(stderr, "error: size %zu not divisible by 32\n", size);
                invalid_param = true;
                break;
            }
            params.test_sizes.push_back(size);
        } else if (arg == "-3") {
            // quick select sizes that probably fit in CPU caches
            params.test_sizes.push_back(L1_SIZE);
            params.test_sizes.push_back(L2_SIZE);
            params.test_sizes.push_back(L3_SIZE);
        } else if (arg == "-4") {
            // quick select cache sizes + memory
            params.test_sizes.push_back(L1_SIZE);
            params.test_sizes.push_back(L2_SIZE);
            params.test_sizes.push_back(L3_SIZE);
            params.test_sizes.push_back(MEM_SIZE);
        } else if (arg == "--op") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            std::string op {argv[i]};
            if (op == "quantize_row_q_reference") {
                params.op_quantize_row_q_reference = true;
            } else if (op == "quantize_row_q") {
                params.op_quantize_row_q = true;
            } else if (op == "dequantize_row_q") {
                params.op_dequantize_row_q = true;
            } else if (op == "quantize_row_q_dot") {
                params.op_quantize_row_q_dot = true;
            } else if (op == "vec_dot_q") {
                params.op_vec_dot_q = true;
            } else {
                invalid_param = true;
                break;
            }
        } else if (arg == "--type") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            params.include_types.push_back(argv[i]);
        } else if (arg == "--alignment-offset") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            int alignment = std::stoi(argv[i]);
            if (alignment < 0 || alignment > MAX_ALIGNMENT) {
            fprintf(stderr, "error: alignment-offset must be less than %d\n", MAX_ALIGNMENT);
                invalid_param = true;
                break;
            }
            params.alignment_offset = alignment;
        } else if ((arg == "-i") || (arg == "--iterations")) {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            int number = std::stoi(argv[i]);
            if (number < 0 || number > MAX_ITERATIONS) {
            fprintf(stderr, "error: iterations must be less than %d\n", MAX_ITERATIONS);
                invalid_param = true;
                break;
            }
            params.iterations = number;
        } else if ((arg == "-h") || (arg == "--help")) {
            usage(argv);
            return 1;
        } else {
            fprintf(stderr, "error: unknown argument: %s\n", arg.c_str());
            return 1;
        }
    }
    if (invalid_param) {
        fprintf(stderr, "error: invalid parameter for argument: %s\n", arg.c_str());
        return 1;
    }

    if (params.test_sizes.empty()) {
        params.test_sizes.push_back(L1_SIZE);
    }
    if (!(params.op_quantize_row_q_reference || params.op_quantize_row_q || params.op_dequantize_row_q || params.op_quantize_row_q_dot || params.op_vec_dot_q)) {
        params.op_quantize_row_q_reference = params.op_quantize_row_q = params.op_dequantize_row_q = params.op_quantize_row_q_dot = params.op_vec_dot_q = true;
    }

    std::sort(params.test_sizes.begin(), params.test_sizes.end());
    size_t largest = params.test_sizes.back();

    std::vector<uint8_t> test_data1_v(largest*4 + MAX_ALIGNMENT*2);
    std::vector<uint8_t> test_data2_v(largest*4 + MAX_ALIGNMENT*2);
    std::vector<uint8_t> test_q1_v   (largest*4 + MAX_ALIGNMENT*2);
    std::vector<uint8_t> test_q2_v   (largest*4 + MAX_ALIGNMENT*2);
    std::vector<uint8_t> test_out_v  (largest*4 + MAX_ALIGNMENT*2);

    float * test_data1 = (float *) align_with_offset(test_data1_v.data(), params.alignment_offset);
    float * test_data2 = (float *) align_with_offset(test_data2_v.data(), params.alignment_offset);
    float * test_q1    = (float *) align_with_offset(test_q1_v.data(),    params.alignment_offset);
    float * test_q2    = (float *) align_with_offset(test_q2_v.data(),    params.alignment_offset);
    float * test_out   = (float *) align_with_offset(test_out_v.data(),   params.alignment_offset);

    generate_data(0, largest, test_data1);
    generate_data(1, largest, test_data2);

    int64_t iterations = params.iterations;


    // Initialize GGML, ensures float conversion tables are initialized
    struct ggml_init_params ggml_params = {
        /* .mem_size   = */ 1*1024,
        /* .mem_buffer = */ NULL,
        /* .no_alloc   = */ true,
    };
    struct ggml_context * ctx = ggml_init(ggml_params);

    for (int i = 0; i < GGML_TYPE_COUNT; i++) {
        ggml_type type = (ggml_type) i;
        const auto * qfns = ggml_get_type_traits(type);
        const auto * qfns_cpu = ggml_get_type_traits_cpu(type);
        if (!params.include_types.empty() && ggml_type_name(type) && std::find(params.include_types.begin(), params.include_types.end(), ggml_type_name(type)) == params.include_types.end()) {
            continue;
        }

        if (qfns_cpu->from_float && qfns->to_float) {
            printf("%s\n", ggml_type_name(type));

            ggml_quantize_init(type);

            if (params.op_quantize_row_q_reference) {
                printf("  quantize_row_q_reference\n");
                for (size_t size : params.test_sizes) {
                    printf("    %zu values (%.2f MB)\n", size, 4*size/(float)(1024*1024));
                    auto quantize_fn = [&](void) -> float {
                        qfns->from_float_ref(test_data1, test_q1, size);
                        return test_q1[0];
                    };
                    size_t quantized_size = ggml_row_size(type, size);
                    benchmark_function(size, quantized_size, iterations, quantize_fn);
                }
                printf("\n");
            }

            if (params.op_quantize_row_q) {
                printf("  quantize_row_q\n");
                for (size_t size : params.test_sizes) {
                    printf("    %zu values (%.2f MB)\n", size, 4*size/(float)(1024*1024));
                    auto quantize_fn = [&](void) -> float {
                        qfns_cpu->from_float(test_data1, test_q1, size);
                        return test_q1[0];
                    };
                    size_t quantized_size = ggml_row_size(type, size);
                    benchmark_function(size, quantized_size, iterations, quantize_fn);
                }
                printf("\n");
            }

            if (params.op_dequantize_row_q) {
                printf("  dequantize_row_q\n");
                qfns_cpu->from_float(test_data1, test_q1, largest);
                for (size_t size : params.test_sizes) {
                    printf("    %zu values (%.2f MB)\n", size, 4*size/(float)(1024*1024));
                    auto quantize_fn = [&](void) -> float {
                        qfns->to_float(test_q1, test_out, size);
                        return test_out[0];
                    };
                    size_t quantized_size = ggml_row_size(type, size);
                    benchmark_function(size, quantized_size, iterations, quantize_fn);
                }
                printf("\n");
            }

            if (params.op_quantize_row_q_dot) {
                printf("  quantize_row_q_dot\n");
                for (size_t size : params.test_sizes) {
                    printf("    %zu values (%.2f MB)\n", size, 4*size/(float)(1024*1024));
                    auto quantize_fn = [&](void) -> float {
                        const auto * vdot = ggml_get_type_traits_cpu(qfns_cpu->vec_dot_type);
                        vdot->from_float(test_data1, test_q1, size);
                        return test_q1[0];
                    };
                    size_t quantized_size = ggml_row_size(type, size);
                    benchmark_function(size, quantized_size, iterations, quantize_fn);
                }
                printf("\n");
            }

            if (params.op_vec_dot_q) {
                printf("  vec_dot_q\n");
                qfns_cpu->from_float(test_data1, test_q1, largest);
                qfns_cpu->from_float(test_data2, test_q2, largest);
                for (size_t size : params.test_sizes) {
                    printf("    %zu values (%.2f MB)\n", size, 4*size/(float)(1024*1024));
                    auto quantize_fn = [&](void) -> float {
                        float result;
                        qfns_cpu->vec_dot(size, &result, 0, test_q1, 0, test_q2, 0, 1);
                        return result;
                    };
                    size_t quantized_size = ggml_row_size(type, size);
                    benchmark_function(size, quantized_size, iterations, quantize_fn);
                }
                printf("\n");
            }
        }
    }

    ggml_free(ctx);

    return 0;
}